

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O1

XrGeneratedDispatchTableCore *
RuntimeInterface::GetDebugUtilsMessengerDispatchTable(XrDebugUtilsMessengerEXT messenger)

{
  RuntimeInterface *pRVar1;
  ulong uVar2;
  long *plVar3;
  int iVar4;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar5;
  XrGeneratedDispatchTableCore *pXVar6;
  ulong uVar7;
  mutex *__mutex;
  long *plVar8;
  long *plVar9;
  long lVar10;
  XrInstance instance;
  
  puVar5 = GetInstance();
  __mutex = &((puVar5->_M_t).
              super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
              super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
              super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
             _messenger_to_instance_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  puVar5 = GetInstance();
  pRVar1 = (puVar5->_M_t).
           super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
           super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
           super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
  uVar2 = *(size_type *)((long)&(pRVar1->_messenger_to_instance_map)._M_h + 8);
  uVar7 = (ulong)messenger % uVar2;
  plVar8 = *(long **)((long)(pRVar1->_messenger_to_instance_map)._M_h._M_buckets + uVar7 * 8);
  plVar9 = (long *)0x0;
  if ((plVar8 != (long *)0x0) &&
     (plVar3 = (long *)*plVar8, plVar9 = plVar8,
     (XrDebugUtilsMessengerEXT)((long *)*plVar8)[1] != messenger)) {
    while (plVar8 = plVar3, plVar3 = (long *)*plVar8, plVar3 != (long *)0x0) {
      plVar9 = (long *)0x0;
      if (((ulong)plVar3[1] % uVar2 != uVar7) ||
         (plVar9 = plVar8, (XrDebugUtilsMessengerEXT)plVar3[1] == messenger)) goto LAB_0011b4eb;
    }
    plVar9 = (long *)0x0;
  }
LAB_0011b4eb:
  if (plVar9 == (long *)0x0) {
    lVar10 = 0;
  }
  else {
    lVar10 = *plVar9;
  }
  GetInstance();
  if (lVar10 == 0) {
    instance = (XrInstance)0x0;
  }
  else {
    instance = *(XrInstance *)(lVar10 + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pXVar6 = GetDispatchTable(instance);
  return pXVar6;
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDebugUtilsMessengerDispatchTable(XrDebugUtilsMessengerEXT messenger) {
    XrInstance runtime_instance = XR_NULL_HANDLE;
    {
        std::lock_guard<std::mutex> mlock(GetInstance()->_messenger_to_instance_mutex);
        auto it = GetInstance()->_messenger_to_instance_map.find(messenger);
        if (it != GetInstance()->_messenger_to_instance_map.end()) {
            runtime_instance = it->second;
        }
    }
    return GetDispatchTable(runtime_instance);
}